

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_log2_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  undefined8 extraout_RDX;
  floatx80 fVar3;
  floatx80 fVar4;
  floatx80 fVar5;
  floatx80 fVar6;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 b;
  floatx80 fp1;
  floatx80 fp0;
  int8_t user_rnd_prec;
  uint64_t uStack_40;
  int8_t user_rnd_mode;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  status_local = (float_status *)a.low;
  a_local.low._0_2_ = a.high;
  fVar4._10_6_ = 0;
  fVar4.low = (long)a._0_10_;
  fVar4.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  uStack_40 = extractFloatx80Frac(fVar4);
  fVar5.high = (uint16_t)a_local.low;
  fVar5.low = (uint64_t)status_local;
  fVar5._10_6_ = 0;
  aSig._0_4_ = extractFloatx80Exp(fVar5);
  a_00.high = (uint16_t)a_local.low;
  a_00.low = (uint64_t)status_local;
  a_00._10_6_ = 0;
  aSig._7_1_ = extractFloatx80Sign(a_00);
  if ((int32_t)aSig == 0x7fff) {
    if ((uStack_40 & 0x7fffffffffffffff) != 0) {
      a_01.high = (uint16_t)a_local.low;
      a_01.low = (uint64_t)status_local;
      a_01._10_6_ = 0;
      propagateFloatx80NaNOneArg(a_01,_aExp);
    }
    if (aSig._7_1_ == '\0') {
      fVar3 = packFloatx80('\0',0x7fff,0);
      a_local.low._0_2_ = fVar3.high;
      goto LAB_008b3188;
    }
  }
  if ((int32_t)aSig == 0) {
    if (uStack_40 == 0) {
      float_raise_m68k('\x04',_aExp);
      fVar3 = packFloatx80('\x01',0x7fff,0);
      a_local.low._0_2_ = fVar3.high;
      goto LAB_008b3188;
    }
    normalizeFloatx80Subnormal_m68k(uStack_40,(int32_t *)&aSig,&stack0xffffffffffffffc0);
  }
  if (aSig._7_1_ == '\0') {
    cVar1 = _aExp->float_rounding_mode;
    cVar2 = _aExp->floatx80_rounding_precision;
    _aExp->float_rounding_mode = '\0';
    _aExp->floatx80_rounding_precision = 'P';
    if (uStack_40 == 0x8000000000000000) {
      _aExp->float_rounding_mode = cVar1;
      _aExp->floatx80_rounding_precision = cVar2;
      fVar4 = int32_to_floatx80_m68k((int32_t)aSig + -0x3fff,_aExp);
      status_local = (float_status *)fVar4.low;
      a_local.low._0_2_ = fVar4.high;
    }
    else {
      a_02.high = (uint16_t)a_local.low;
      a_02.low = (uint64_t)status_local;
      a_02._10_6_ = 0;
      fVar4 = floatx80_logn_m68k(a_02,_aExp);
      fVar5 = packFloatx80('\0',0x3fff,0xb8aa3b295c17f0bc);
      _aExp->float_rounding_mode = cVar1;
      _aExp->floatx80_rounding_precision = cVar2;
      a_03._10_6_ = 0;
      a_03.low = (long)fVar4._0_10_;
      a_03.high = (short)(fVar4._0_10_ >> 0x40);
      b._10_6_ = 0;
      b.low = (long)fVar5._0_10_;
      b.high = (short)(fVar5._0_10_ >> 0x40);
      fVar4 = floatx80_mul_m68k(a_03,b,_aExp);
      status_local = (float_status *)fVar4.low;
      a_local.low._0_2_ = fVar4.high;
    }
    float_raise_m68k(' ',_aExp);
    fVar3._8_8_ = extraout_RDX;
    fVar3.low = (uint64_t)status_local;
  }
  else {
    float_raise_m68k('\x01',_aExp);
    fVar3 = floatx80_default_nan_m68k(_aExp);
    a_local.low._0_2_ = fVar3.high;
  }
LAB_008b3188:
  a_local._8_8_ = fVar3.low;
  fVar6._10_6_ = fVar3._10_6_;
  fVar6.high = (uint16_t)a_local.low;
  fVar6.low = a_local._8_8_;
  return fVar6;
}

Assistant:

floatx80 floatx80_log2(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    floatx80 fp0, fp1;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign == 0) {
            return packFloatx80(0, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
    }

    if (aExp == 0) {
        if (aSig == 0) {
            float_raise(float_flag_divbyzero, status);
            return packFloatx80(1, floatx80_infinity.high,
                                floatx80_infinity.low);
        }
        normalizeFloatx80Subnormal(aSig, &aExp, &aSig);
    }

    if (aSign) {
        float_raise(float_flag_invalid, status);
        return floatx80_default_nan(status);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    if (aSig == one_sig) { /* X is 2^k */
        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = int32_to_floatx80(aExp - 0x3FFF, status);
    } else {
        fp0 = floatx80_logn(a, status);
        fp1 = packFloatx80(0, 0x3FFF, UINT64_C(0xB8AA3B295C17F0BC)); /* INV_L2 */

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_mul(fp0, fp1, status); /* LOGN(X)*INV_L2 */
    }

    float_raise(float_flag_inexact, status);

    return a;
}